

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordingDescriptorPoller.cpp
# Opt level: O2

void __thiscall
aeron::archive::RecordingDescriptorPoller::RecordingDescriptorPoller
          (RecordingDescriptorPoller *this,shared_ptr<aeron::Subscription> *subscription,
          int32_t fragmentLimit,int64_t controlSessionId)

{
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  std::__shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2> *)this,
             &subscription->super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>);
  this->fragmentLimit_ = fragmentLimit;
  this->controlSessionId_ = controlSessionId;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<aeron::ControlledPollAction_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/RecordingDescriptorPoller.cpp:33:26)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<aeron::ControlledPollAction_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/RecordingDescriptorPoller.cpp:33:26)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  ControlledFragmentAssembler::ControlledFragmentAssembler
            (&this->fragmentAssembler_,(controlled_poll_fragment_handler_t *)&local_38,0x1000);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  (this->consumer_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->consumer_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->consumer_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->consumer_).super__Function_base._M_functor + 8) = 0;
  this->isDispatchComplete_ = false;
  return;
}

Assistant:

RecordingDescriptorPoller::RecordingDescriptorPoller(const std::shared_ptr<Subscription>& subscription,
                                                     std::int32_t fragmentLimit, std::int64_t controlSessionId)
    : subscription_(subscription)
    , fragmentLimit_(fragmentLimit)
    , controlSessionId_(controlSessionId)
    , fragmentAssembler_([this](concurrent::AtomicBuffer& buffer, util::index_t offset, util::index_t length,
                                Header& header) { return onFragment(buffer, offset, length, header); }) {}